

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O1

void board::Board::INIT(void)

{
  uint uVar1;
  long lVar2;
  unsigned_long uVar3;
  result_type rVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int rank;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  uniform_int_distribution<unsigned_long> dist;
  mt19937_64 e2;
  random_device rd;
  uniform_int_distribution<unsigned_long> local_1d90;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_1d80._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar6 = local_1d80._M_x[0];
  do {
    uVar6 = (uVar6 >> 0x3e ^ uVar6) * 0x5851f42d4c957f2d + lVar2;
    local_1d80._M_x[lVar2] = uVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_1d80._M_p = 0x138;
  uVar3 = llround(2.305843009213694e+18);
  local_1d90._M_param._M_b = llround(4.611686018427388e+18);
  lVar2 = 0;
  local_1d90._M_param._M_a = uVar3;
  do {
    lVar14 = lVar2 + 0x3c0;
    lVar8 = 0;
    do {
      rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_1d90,&local_1d80,&local_1d90._M_param);
      *(result_type *)((long)PIECE_KEYS[0] + lVar2 + lVar8) = rVar4;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x3c0);
    lVar2 = lVar14;
  } while (lVar14 != 0x30c0);
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_1d90,&local_1d80,&local_1d90._M_param);
  lVar2 = 0;
  do {
    *(result_type *)((long)CASTLE_KEYS + lVar2) = rVar4;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x80);
  SIDE_KEY = std::uniform_int_distribution<unsigned_long>::operator()
                       (&local_1d90,&local_1d80,&local_1d90._M_param);
  FILE_MASK[0] = 0;
  FILE_MASK[1] = 0;
  FILE_MASK[2] = 0;
  FILE_MASK[3] = 0;
  FILE_MASK[4] = 0;
  FILE_MASK[5] = 0;
  FILE_MASK[6] = 0;
  FILE_MASK[7] = 0;
  RANK_MASK[0] = 0;
  RANK_MASK[1] = 0;
  RANK_MASK[2] = 0;
  RANK_MASK[3] = 0;
  RANK_MASK[4] = 0;
  RANK_MASK[5] = 0;
  RANK_MASK[6] = 0;
  RANK_MASK[7] = 0;
  uVar6 = 0;
  memset(PASSED_PAWN_MASK,0,0x400);
  memset(ISOLATED_PAWN_MASK,0,0x200);
  lVar2 = 0;
  do {
    uVar10 = RANK_MASK[lVar2];
    lVar8 = 0;
    uVar5 = uVar6;
    do {
      *(ulong *)((long)FILE_MASK + lVar8) =
           *(ulong *)((long)FILE_MASK + lVar8) | 1L << ((byte)uVar5 & 0x3f);
      uVar10 = uVar10 | 1L << (uVar5 & 0x3f);
      lVar8 = lVar8 + 8;
      uVar5 = uVar5 + 1;
    } while (lVar8 != 0x40);
    RANK_MASK[lVar2] = uVar10;
    lVar2 = lVar2 + 1;
    uVar6 = uVar6 + 8;
  } while (lVar2 != 8);
  uVar1 = 0xfffffff7;
  uVar6 = 9;
  lVar2 = 8;
  uVar5 = 0xffffffffffffffff;
  uVar11 = 0;
  do {
    if (uVar11 < 0x38) {
      uVar10 = PASSED_PAWN_MASK[0][uVar11];
      uVar13 = uVar11;
      do {
        uVar10 = uVar10 | 0x100L << ((byte)uVar13 & 0x3f);
        bVar15 = uVar13 < 0x30;
        uVar13 = uVar13 + 8;
      } while (bVar15);
      PASSED_PAWN_MASK[0][uVar11] = uVar10;
    }
    if (7 < uVar11) {
      uVar10 = PASSED_PAWN_MASK[1][uVar11];
      lVar8 = lVar2;
      do {
        uVar10 = uVar10 | 1L << ((ulong)((int)lVar8 - 0x10) & 0x3f);
        lVar8 = lVar8 + -8;
      } while (0xf < lVar8);
      PASSED_PAWN_MASK[1][uVar11] = uVar10;
    }
    uVar13 = (ulong)uVar1;
    if ((0xfefefefefefefefeU >> (uVar11 & 0x3f) & 1) != 0) {
      ISOLATED_PAWN_MASK[uVar11] = ISOLATED_PAWN_MASK[uVar11] | FILE_MASK[FILES[uVar11] - 1];
      if (uVar11 < 0x39) {
        uVar10 = PASSED_PAWN_MASK[0][uVar11];
        uVar12 = uVar5;
        do {
          uVar12 = uVar12 + 8;
          uVar10 = uVar10 | 1L << (uVar12 & 0x3f);
        } while (uVar12 < 0x38);
        PASSED_PAWN_MASK[0][uVar11] = uVar10;
      }
      if (8 < uVar11) {
        uVar10 = PASSED_PAWN_MASK[1][uVar11];
        uVar9 = uVar5 & 0xffffffff;
        uVar12 = uVar13;
        do {
          uVar10 = uVar10 | 1L << (uVar12 & 0x3f);
          uVar12 = uVar12 - 8;
          uVar7 = (int)uVar9 - 8;
          uVar9 = (ulong)uVar7;
        } while (7 < (int)uVar7);
        PASSED_PAWN_MASK[1][uVar11] = uVar10;
      }
    }
    if ((0x7f7f7f7f7f7f7f7fU >> (uVar11 & 0x3f) & 1) != 0) {
      ISOLATED_PAWN_MASK[uVar11] = ISOLATED_PAWN_MASK[uVar11] | FILE_MASK[(long)FILES[uVar11] + 1];
      if (uVar11 < 0x37) {
        uVar10 = PASSED_PAWN_MASK[0][uVar11];
        uVar12 = uVar6;
        do {
          uVar10 = uVar10 | 1L << (uVar12 & 0x3f);
          bVar15 = uVar12 < 0x38;
          uVar12 = uVar12 + 8;
        } while (bVar15);
        PASSED_PAWN_MASK[0][uVar11] = uVar10;
      }
      if (8 < uVar11) {
        uVar10 = PASSED_PAWN_MASK[1][uVar11];
        uVar12 = uVar5 & 0xffffffff;
        do {
          uVar10 = uVar10 | 1L << (uVar13 & 0x3f);
          uVar13 = uVar13 - 8;
          uVar7 = (int)uVar12 - 8;
          uVar12 = (ulong)uVar7;
        } while (7 < (int)uVar7);
        PASSED_PAWN_MASK[1][uVar11] = uVar10;
      }
    }
    uVar11 = uVar11 + 1;
    uVar1 = uVar1 + 1;
    uVar6 = uVar6 + 1;
    lVar2 = lVar2 + 1;
    uVar5 = uVar5 + 1;
  } while (uVar11 != 0x40);
  std::random_device::_M_fini();
  return;
}

Assistant:

void board::Board::INIT()
{
    // Zobrist hash keys
    std::random_device rd;
    std::mt19937_64 e2(rd());
    std::uniform_int_distribution<uint64_t> dist(std::llround(std::pow(2, 61)), std::llround(std::pow(2, 62)));
    for (auto& i : PIECE_KEYS) {
        for (auto& j : i) {
            j = dist(e2);
        }
    }
    std::fill(std::begin(CASTLE_KEYS), std::end(CASTLE_KEYS), dist(e2));
    SIDE_KEY = dist(e2);
    // Bitmasks
    int square;
    int tSquare;
    for (int i = 0; i < 8; i++) {
        FILE_MASK[i] = 0ULL;
        RANK_MASK[i] = 0ULL;
    }
    for (int i = 0; i < 64; i++) {
        PASSED_PAWN_MASK[0][i] = 0ULL;
        PASSED_PAWN_MASK[1][i] = 0ULL;
        ISOLATED_PAWN_MASK[i] = 0ULL;
    }
    for (int rank = RANK_1; rank <= RANK_8; rank++) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = rank * 8 + file;
            FILE_MASK[file] |= (1ULL << square);
            RANK_MASK[rank] |= (1ULL << square);
        }
    }
    for (square = 0; square < 64; square++) {
        tSquare = square + 8;
        while (tSquare < 64) {
            PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
            tSquare += 8;
        }
        tSquare = square - 8;
        while (tSquare >= 0) {
            PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
            tSquare -= 8;
        }
        if (Board::FILES[square] > FILE_A) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] - 1];
            tSquare = square + 7;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
        if (Board::FILES[square] < FILE_H) {
            ISOLATED_PAWN_MASK[square] |= FILE_MASK[Board::FILES[square] + 1];
            tSquare = square + 9;
            while (tSquare < 64) {
                PASSED_PAWN_MASK[WHITE][square] |= (1ULL << tSquare);
                tSquare += 8;
            }
            tSquare = square - 9;
            while (tSquare >= 0) {
                PASSED_PAWN_MASK[BLACK][square] |= (1ULL << tSquare);
                tSquare -= 8;
            }
        }
    }
}